

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict7 *data,int finishing)

{
  archive *a;
  int iVar1;
  lzma_ret lVar2;
  uint64_t uVar3;
  int ret;
  int finishing_local;
  private_data_conflict7 *data_local;
  archive_write_filter *f_local;
  
  while( true ) {
    if ((data->stream).avail_out == 0) {
      data->total_out = data->compressed_buffer_size + data->total_out;
      iVar1 = __archive_write_filter(f->next_filter,data->compressed,data->compressed_buffer_size);
      if (iVar1 != 0) {
        return -0x1e;
      }
      (data->stream).next_out = data->compressed;
      (data->stream).avail_out = data->compressed_buffer_size;
    }
    if ((finishing == 0) && ((data->stream).avail_in == 0)) {
      return 0;
    }
    lVar2 = lzma_code(&data->stream,(uint)(finishing != 0) + (uint)(finishing != 0) * 2);
    if (lVar2 != LZMA_OK) break;
    if ((finishing == 0) && ((data->stream).avail_in == 0)) {
      return 0;
    }
  }
  if (lVar2 == LZMA_STREAM_END) {
    if (finishing != 0) {
      return 0;
    }
    archive_set_error(f->archive,-1,"lzma compression data error");
    return -0x1e;
  }
  if (lVar2 != LZMA_MEMLIMIT_ERROR) {
    archive_set_error(f->archive,-1,"lzma compression failed: lzma_code() call returned status %d",
                      (ulong)lVar2);
    return -0x1e;
  }
  a = f->archive;
  uVar3 = lzma_memusage(&data->stream);
  archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                    uVar3 + 0xfffff >> 0x14);
  return -0x1e;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK) {
				/* TODO: Handle this write failure */
				return (ARCHIVE_FATAL);
			}
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = BZ2_bzCompress(&(data->stream),
		    finishing ? BZ_FINISH : BZ_RUN);

		switch (ret) {
		case BZ_RUN_OK:
			/* In non-finishing case, did compressor
			 * consume everything? */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			break;
		case BZ_FINISH_OK:  /* Finishing: There's more work to do */
			break;
		case BZ_STREAM_END: /* Finishing: all done */
			/* Only occurs in finishing case */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error */
			archive_set_error(f->archive,
			    ARCHIVE_ERRNO_PROGRAMMER,
			    "Bzip2 compression failed;"
			    " BZ2_bzCompress() returned %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}